

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O2

int Ssw_RarSimulate(Aig_Man_t *pAig,Ssw_RarPars_t *pPars)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  abctime aVar3;
  abctime aVar4;
  Ssw_RarMan_t *p;
  Vec_Int_t *pVVar5;
  abctime aVar6;
  Ssw_RarMan_t *pSVar7;
  Abc_Cex_t *pAVar8;
  ulong uVar9;
  int Fill;
  ulong uVar10;
  abctime time;
  abctime time_00;
  abctime time_01;
  char *pcVar11;
  uint uVar12;
  int iVar13;
  ulong in_R8;
  int iVar14;
  ulong uVar15;
  int iVar16;
  uint local_58;
  int local_54;
  int local_44;
  long local_38;
  
  aVar3 = Abc_Clock();
  iVar16 = pPars->TimeOut;
  if ((long)iVar16 == 0) {
    local_38 = 0;
  }
  else {
    aVar4 = Abc_Clock();
    local_38 = aVar4 + (long)iVar16 * 1000000;
  }
  if (pAig->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswRarity.c"
                  ,0x3da,"int Ssw_RarSimulate(Aig_Man_t *, Ssw_RarPars_t *)");
  }
  if (pAig->nConstrs != 0) {
    __assert_fail("Aig_ManConstrNum(pAig) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswRarity.c"
                  ,0x3db,"int Ssw_RarSimulate(Aig_Man_t *, Ssw_RarPars_t *)");
  }
  local_44 = pPars->nRandSeed;
  if (pAig->pSeqModel != (Abc_Cex_t *)0x0) {
    free(pAig->pSeqModel);
    pAig->pSeqModel = (Abc_Cex_t *)0x0;
  }
  if (pPars->fVerbose != 0) {
    in_R8 = (ulong)(uint)pPars->nRounds;
    Abc_Print(pPars->nRandSeed,
              "Rarity simulation with %d words, %d frames, %d rounds, %d restart, %d seed, and %d sec timeout.\n"
              ,(ulong)(uint)pPars->nWords,(ulong)(uint)pPars->nFrames,in_R8,
              (ulong)(uint)pPars->nRestart,(ulong)(uint)pPars->nRandSeed,(ulong)(uint)pPars->TimeOut
             );
  }
  Ssw_RarManPrepareRandom(local_44);
  p = Ssw_RarManStart(pAig,pPars);
  uVar12 = pPars->nWords * pAig->nRegs;
  pSVar7 = (Ssw_RarMan_t *)(ulong)uVar12;
  pVVar5 = Vec_IntStart(uVar12);
  p->vInits = pVVar5;
  pPars->nSolved = 0;
  aVar4 = Abc_Clock();
  local_54 = -1;
  uVar15 = 0xffffffff;
  local_58 = 0;
  iVar16 = 0;
  while( true ) {
    iVar13 = (int)pSVar7;
    if ((pPars->nRounds != 0) && (pPars->nRounds <= (int)(pPars->nRestart * local_58 + iVar16)))
    break;
    Abc_Clock();
    uVar15 = 0;
    while (iVar14 = (int)uVar15, iVar14 < pPars->nFrames) {
      if (iVar14 == 0) {
        pVVar5 = p->vInits;
      }
      else {
        pVVar5 = (Vec_Int_t *)0x0;
      }
      Ssw_RarManSimulate(p,pVVar5,0,0);
      iVar13 = p->pPars->nFrames;
      aVar6 = Abc_Clock();
      pSVar7 = p;
      iVar2 = Ssw_RarManCheckNonConstOutputs(p,iVar13 * iVar16 + iVar14,aVar6 - aVar3);
      uVar12 = (uint)in_R8;
      iVar13 = (int)pSVar7;
      if (iVar2 == 1) {
        if (pPars->fSolveAll == 0) {
          if (pPars->fVerbose != 0) {
            Abc_Print(iVar13,"\n");
          }
          Ssw_RarManPrepareRandom(local_44);
          if (pPars->fVerbose != 0) {
            uVar12 = local_58;
            Abc_Print(local_44,"Simulated %d frames for %d rounds with %d restarts.\n",
                      (ulong)(uint)pPars->nFrames,(ulong)(pPars->nRestart * local_58 + iVar16));
          }
          pSVar7 = p;
          pAVar8 = Ssw_RarDeriveCex(p,p->pPars->nFrames * iVar16 + iVar14,p->iFailPo,p->iFailPat,
                                    uVar12);
          pAig->pSeqModel = pAVar8;
          pcVar11 = "Output %d of miter \"%s\" was asserted in frame %d.  ";
          local_54 = 0;
          Abc_Print((int)pSVar7,"Output %d of miter \"%s\" was asserted in frame %d.  ",
                    (ulong)(uint)pAVar8->iPo,pAig->pName,(ulong)(uint)pAVar8->iFrame);
          aVar4 = Abc_Clock();
          iVar13 = (int)aVar4 - (int)aVar3;
          Abc_PrintTime(iVar13,pcVar11,time_00);
          goto LAB_004ed877;
        }
        local_54 = 0;
        aVar4 = Abc_Clock();
      }
      else if (iVar2 == 2) {
        Abc_Print(iVar13,"Quitting due to callback on fail.\n");
        goto LAB_004ed877;
      }
      if (pPars->TimeOut != 0) {
        aVar6 = Abc_Clock();
        iVar13 = (int)pSVar7;
        if (aVar6 <= local_38) goto LAB_004ed563;
        if (pPars->fSilent == 0) {
          if ((pPars->fVerbose != 0) && (pPars->fSolveAll == 0)) {
            Abc_Print(iVar13,"\n");
          }
          Abc_Print(iVar13,
                    "Simulated %d frames for %d rounds with %d restarts and solved %d outputs.  ",
                    (ulong)(uint)pPars->nFrames,(ulong)(pPars->nRestart * local_58 + iVar16),
                    (ulong)local_58,(ulong)(uint)pPars->nSolved);
          uVar12 = pPars->TimeOut;
          pcVar11 = "Reached timeout (%d sec).\n";
LAB_004ed870:
          Abc_Print(iVar13,pcVar11,(ulong)uVar12);
        }
        goto LAB_004ed877;
      }
LAB_004ed563:
      if (aVar4 != 0 && pPars->TimeOutGap != 0) {
        aVar6 = Abc_Clock();
        iVar13 = (int)pSVar7;
        if ((long)pPars->TimeOutGap * 1000000 + aVar4 < aVar6) {
          if (pPars->fSilent == 0) {
            if ((pPars->fVerbose != 0) && (pPars->fSolveAll == 0)) {
              Abc_Print(iVar13,"\n");
            }
            Abc_Print(iVar13,
                      "Simulated %d frames for %d rounds with %d restarts and solved %d outputs.  ",
                      (ulong)(uint)pPars->nFrames,(ulong)(pPars->nRestart * local_58 + iVar16),
                      (ulong)local_58,(ulong)(uint)pPars->nSolved);
            uVar12 = pPars->TimeOutGap;
            pcVar11 = "Reached gap timeout (%d sec).\n";
            goto LAB_004ed870;
          }
          goto LAB_004ed877;
        }
      }
      if ((pPars->fSolveAll != 0) && (pVVar1 = p->vCexes, pVVar1 != (Vec_Ptr_t *)0x0)) {
        uVar10 = 0;
        uVar9 = (ulong)(uint)pVVar1->nSize;
        if (pVVar1->nSize < 1) {
          uVar9 = uVar10;
        }
        iVar2 = 0;
        for (; iVar13 = (int)pSVar7, uVar9 != uVar10; uVar10 = uVar10 + 1) {
          pSVar7 = (Ssw_RarMan_t *)pVVar1->pArray;
          iVar2 = iVar2 + (uint)((&pSVar7->pPars)[uVar10] == (Ssw_RarPars_t *)0x0);
        }
        if (iVar2 == 0) goto LAB_004ed877;
      }
      uVar15 = (ulong)(iVar14 + 1);
    }
    if (iVar16 == pPars->nRestart && pPars->nRestart != 0) {
      local_44 = (local_44 + 1) % 1000;
      Ssw_RarManPrepareRandom(local_44);
      pSVar7 = (Ssw_RarMan_t *)p->vInits;
      Vec_IntFill((Vec_Int_t *)pSVar7,pPars->nWords * pAig->nRegs,Fill);
      local_58 = local_58 + 1;
      p->vPatBests->nSize = 0;
      iVar16 = -1;
    }
    else {
      pSVar7 = p;
      Ssw_RarTransferPatterns(p,p->vInits);
    }
    iVar13 = (int)pSVar7;
    if (pPars->fVerbose != 0) {
      if (pPars->fSolveAll == 0) {
        Abc_Print(iVar13,".");
      }
      else {
        Abc_Print(iVar13,"Starts =%6d   ",(ulong)local_58);
        iVar14 = iVar16;
        if (iVar16 == -1) {
          iVar14 = 0;
        }
        Abc_Print(iVar13,"Rounds =%6d   ",(ulong)(iVar14 + pPars->nRestart * local_58));
        Abc_Print(iVar13,"Frames =%6d   ",
                  (ulong)((pPars->nRestart * local_58 + iVar16) * pPars->nFrames));
        pcVar11 = "CEX =%6d (%6.2f %%)   ";
        Abc_Print(iVar13,"CEX =%6d (%6.2f %%)   ",
                  ((double)pPars->nSolved * 100.0) / (double)p->pAig->nTruePos);
        aVar6 = Abc_Clock();
        pSVar7 = (Ssw_RarMan_t *)(aVar6 - aVar3);
        Abc_PrintTime((int)pSVar7,pcVar11,time);
      }
    }
    iVar16 = iVar16 + 1;
  }
LAB_004ed877:
  if ((pPars->fSetLastState != 0) && (pVVar5 = p->vInits, pVVar5 != (Vec_Int_t *)0x0)) {
    iVar13 = pAig->nRegs;
    if (pVVar5->nSize % iVar13 != 0) {
      __assert_fail("Vec_IntSize(p->vInits) % Aig_ManRegNum(pAig) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswRarity.c"
                    ,0x455,"int Ssw_RarSimulate(Aig_Man_t *, Ssw_RarPars_t *)");
    }
    if (pVVar5->nSize < iVar13) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x2ac,"void Vec_IntShrink(Vec_Int_t *, int)");
    }
    pVVar5->nSize = iVar13;
    pAig->pData = pVVar5;
    p->vInits = (Vec_Int_t *)0x0;
  }
  if ((((pPars->nSolved == 0) && (iVar16 == pPars->nRounds)) && ((int)uVar15 == pPars->nFrames)) &&
     (pPars->fSilent == 0)) {
    if (pPars->fVerbose != 0) {
      Abc_Print(iVar13,"\n");
      uVar15 = (ulong)(uint)pPars->nFrames;
    }
    pcVar11 = "Simulation of %d frames for %d rounds with %d restarts did not assert POs.    ";
    Abc_Print(iVar13,
              "Simulation of %d frames for %d rounds with %d restarts did not assert POs.    ",
              uVar15,(ulong)(pPars->nRestart * local_58 + iVar16));
    aVar4 = Abc_Clock();
    Abc_PrintTime((int)aVar4 - (int)aVar3,pcVar11,time_01);
  }
  Ssw_RarManStop(p);
  return local_54;
}

Assistant:

int Ssw_RarSimulate( Aig_Man_t * pAig, Ssw_RarPars_t * pPars )
{
    int fTryBmc = 0;
    int fMiter = 1;
    Ssw_RarMan_t * p;
    int r, f = -1;
    abctime clk, clkTotal = Abc_Clock();
    abctime nTimeToStop = pPars->TimeOut ? pPars->TimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0;
    abctime timeLastSolved = 0;
    int nNumRestart = 0;
    int nSavedSeed = pPars->nRandSeed;
    int RetValue = -1;
    int iFrameFail = -1;
    assert( Aig_ManRegNum(pAig) > 0 );
    assert( Aig_ManConstrNum(pAig) == 0 );
    ABC_FREE( pAig->pSeqModel );
    // consider the case of empty AIG
//    if ( Aig_ManNodeNum(pAig) == 0 )
//        return -1;
    // check trivially SAT miters
//    if ( fMiter && Ssw_RarCheckTrivial( pAig, fVerbose ) )
//        return 0;
    if ( pPars->fVerbose )
        Abc_Print( 1, "Rarity simulation with %d words, %d frames, %d rounds, %d restart, %d seed, and %d sec timeout.\n",
            pPars->nWords, pPars->nFrames, pPars->nRounds, pPars->nRestart, pPars->nRandSeed, pPars->TimeOut );
    // reset random numbers
    Ssw_RarManPrepareRandom( nSavedSeed );

    // create manager
    p = Ssw_RarManStart( pAig, pPars );
    p->vInits = Vec_IntStart( Aig_ManRegNum(pAig) * pPars->nWords );

    // perform simulation rounds
    pPars->nSolved = 0;
    timeLastSolved = Abc_Clock();
    for ( r = 0; !pPars->nRounds || (nNumRestart * pPars->nRestart + r < pPars->nRounds); r++ )
    {
        clk = Abc_Clock();
        if ( fTryBmc )
        {
            Aig_Man_t * pNewAig = Saig_ManDupWithPhase( pAig, p->vInits );
            Saig_BmcPerform( pNewAig, 0, 100, 2000, 3, 0, 0, 1 /*fVerbose*/, 0, &iFrameFail, 0 );
//            if ( pNewAig->pSeqModel != NULL )
//                Abc_Print( 1, "BMC has found a counter-example in frame %d.\n", iFrameFail );
            Aig_ManStop( pNewAig );
        }
        // simulate
        for ( f = 0; f < pPars->nFrames; f++ )
        {
            Ssw_RarManSimulate( p, f ? NULL : p->vInits, 0, 0 );
            if ( fMiter )
            {
                int Status = Ssw_RarManCheckNonConstOutputs(p, r * p->pPars->nFrames + f, Abc_Clock() - clkTotal);
                if ( Status == 2 )
                {
                    Abc_Print( 1, "Quitting due to callback on fail.\n" );
                    goto finish;
                }
                if ( Status == 1 ) // found CEX
                {
                    RetValue = 0;
                    if ( !pPars->fSolveAll )
                    {
                        if ( pPars->fVerbose ) Abc_Print( 1, "\n" );
        //                Abc_Print( 1, "Simulation asserted a PO in frame f: %d <= f < %d.\n", r * nFrames, (r+1) * nFrames );
                        Ssw_RarManPrepareRandom( nSavedSeed );
                        if ( pPars->fVerbose )
                            Abc_Print( 1, "Simulated %d frames for %d rounds with %d restarts.\n", pPars->nFrames, nNumRestart * pPars->nRestart + r, nNumRestart );
                        pAig->pSeqModel = Ssw_RarDeriveCex( p, r * p->pPars->nFrames + f, p->iFailPo, p->iFailPat, pPars->fVerbose );
                        // print final report
                        Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", pAig->pSeqModel->iPo, pAig->pName, pAig->pSeqModel->iFrame );
                        Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
                        goto finish;
                    }
                    timeLastSolved = Abc_Clock();
                }
                // else - did not find a counter example
            }
            // check timeout
            if ( pPars->TimeOut && Abc_Clock() > nTimeToStop )
            {
                if ( !pPars->fSilent )
                {
                if ( pPars->fVerbose && !pPars->fSolveAll ) Abc_Print( 1, "\n" );
                Abc_Print( 1, "Simulated %d frames for %d rounds with %d restarts and solved %d outputs.  ", pPars->nFrames, nNumRestart * pPars->nRestart + r, nNumRestart, pPars->nSolved );
                Abc_Print( 1, "Reached timeout (%d sec).\n",  pPars->TimeOut );
                }
                goto finish;
            }
            if ( pPars->TimeOutGap && timeLastSolved && Abc_Clock() > timeLastSolved + pPars->TimeOutGap * CLOCKS_PER_SEC )
            {
                if ( !pPars->fSilent )
                {
                if ( pPars->fVerbose && !pPars->fSolveAll ) Abc_Print( 1, "\n" );
                Abc_Print( 1, "Simulated %d frames for %d rounds with %d restarts and solved %d outputs.  ", pPars->nFrames, nNumRestart * pPars->nRestart + r, nNumRestart, pPars->nSolved );
                Abc_Print( 1, "Reached gap timeout (%d sec).\n",  pPars->TimeOutGap );
                }
                goto finish;
            }
            // check if all outputs are solved by now
            if ( pPars->fSolveAll && p->vCexes && Vec_PtrCountZero(p->vCexes) == 0 )
                goto finish;
        }
        // get initialization patterns
        if ( pPars->nRestart && r == pPars->nRestart )
        {
            r = -1;
            nSavedSeed = (nSavedSeed + 1) % 1000;
            Ssw_RarManPrepareRandom( nSavedSeed );
            Vec_IntFill( p->vInits, Aig_ManRegNum(pAig) * pPars->nWords, 0 );
            nNumRestart++;
            Vec_IntClear( p->vPatBests );
            // clean rarity info
//            memset( p->pRarity, 0, sizeof(int) * (1 << nBinSize) * p->nGroups );
        }
        else
            Ssw_RarTransferPatterns( p, p->vInits );
        // printout
        if ( pPars->fVerbose )
        {
            if ( pPars->fSolveAll )
            {
                Abc_Print( 1, "Starts =%6d   ",  nNumRestart );
                Abc_Print( 1, "Rounds =%6d   ",  nNumRestart * pPars->nRestart + ((r==-1)?0:r) );
                Abc_Print( 1, "Frames =%6d   ", (nNumRestart * pPars->nRestart + r) * pPars->nFrames );
                Abc_Print( 1, "CEX =%6d (%6.2f %%)   ", pPars->nSolved, 100.0*pPars->nSolved/Saig_ManPoNum(p->pAig) );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
            }
            else
                Abc_Print( 1, "." );
        }

    }
finish:
    if ( pPars->fSetLastState && p->vInits )
    {
        assert( Vec_IntSize(p->vInits) % Aig_ManRegNum(pAig) == 0 );
        Vec_IntShrink( p->vInits, Aig_ManRegNum(pAig) );
        pAig->pData = p->vInits;  p->vInits = NULL;
    }
    if ( pPars->nSolved )
    {
/*
        if ( !pPars->fSilent )
        {
        if ( pPars->fVerbose && !pPars->fSolveAll ) Abc_Print( 1, "\n" );
        Abc_Print( 1, "Simulation of %d frames for %d rounds with %d restarts asserted %d (out of %d) POs.    ", pPars->nFrames, nNumRestart * pPars->nRestart + r, nNumRestart, pPars->nSolved, Saig_ManPoNum(p->pAig) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
        }
*/
    }
    else if ( r == pPars->nRounds && f == pPars->nFrames )
    {
        if ( !pPars->fSilent )
        {
        if ( pPars->fVerbose ) Abc_Print( 1, "\n" );
        Abc_Print( 1, "Simulation of %d frames for %d rounds with %d restarts did not assert POs.    ", pPars->nFrames, nNumRestart * pPars->nRestart + r, nNumRestart );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
        }
    }
    // cleanup
    Ssw_RarManStop( p );
    return RetValue;
}